

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_cnv.cpp
# Opt level: O2

void ucnv_toUWriteCodePoint_63
               (UConverter *cnv,UChar32 c,UChar **target,UChar *targetLimit,int32_t **offsets,
               int32_t sourceIndex,UErrorCode *pErrorCode)

{
  bool bVar1;
  UChar *pUVar2;
  int8_t iVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  int32_t *piVar7;
  
  uVar5 = (ulong)(uint)c;
  pUVar2 = *target;
  if (targetLimit <= pUVar2) goto LAB_00300cf1;
  if (c < 0x10000) {
    *pUVar2 = (UChar)c;
    uVar5 = 0xffffffffffffffff;
LAB_00300cc7:
    lVar6 = 2;
    bVar1 = false;
  }
  else {
    *pUVar2 = (short)((uint)c >> 10) + L'ퟀ';
    uVar4 = c & 0x3ffU | 0xdc00;
    uVar5 = (ulong)uVar4;
    if (targetLimit <= pUVar2 + 1) goto LAB_00300cc7;
    pUVar2[1] = (UChar)uVar4;
    lVar6 = 4;
    bVar1 = true;
    uVar5 = 0xffffffffffffffff;
  }
  pUVar2 = (UChar *)((long)pUVar2 + lVar6);
  if ((offsets != (int32_t **)0x0) && (piVar7 = *offsets, piVar7 != (int32_t *)0x0)) {
    *piVar7 = sourceIndex;
    if (bVar1) {
      piVar7[1] = sourceIndex;
      piVar7 = piVar7 + 2;
    }
    else {
      piVar7 = piVar7 + 1;
    }
    *offsets = piVar7;
  }
LAB_00300cf1:
  *target = pUVar2;
  if (-1 < (int)(uint)uVar5) {
    if (cnv != (UConverter *)0x0) {
      if ((uint)uVar5 < 0x10000) {
        iVar3 = '\x01';
      }
      else {
        cnv->UCharErrorBuffer[1] = (ushort)uVar5 & 0x3ff | 0xdc00;
        iVar3 = '\x02';
        uVar5 = (ulong)(((uint)(uVar5 >> 10) & 0x3fffff) - 0x2840);
      }
      cnv->UCharErrorBuffer[0] = (UChar)uVar5;
      cnv->UCharErrorBufferLength = iVar3;
    }
    *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
  }
  return;
}

Assistant:

U_CFUNC void
ucnv_toUWriteCodePoint(UConverter *cnv,
                       UChar32 c,
                       UChar **target, const UChar *targetLimit,
                       int32_t **offsets,
                       int32_t sourceIndex,
                       UErrorCode *pErrorCode) {
    UChar *t;
    int32_t *o;

    t=*target;

    if(t<targetLimit) {
        if(c<=0xffff) {
            *t++=(UChar)c;
            c=U_SENTINEL;
        } else /* c is a supplementary code point */ {
            *t++=U16_LEAD(c);
            c=U16_TRAIL(c);
            if(t<targetLimit) {
                *t++=(UChar)c;
                c=U_SENTINEL;
            }
        }

        /* write offsets */
        if(offsets!=NULL && (o=*offsets)!=NULL) {
            *o++=sourceIndex;
            if((*target+1)<t) {
                *o++=sourceIndex;
            }
            *offsets=o;
        }
    }

    *target=t;

    /* write overflow from c */
    if(c>=0) {
        if(cnv!=NULL) {
            int8_t i=0;
            U16_APPEND_UNSAFE(cnv->UCharErrorBuffer, i, c);
            cnv->UCharErrorBufferLength=i;
        }
        *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
    }
}